

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

UChar32 utf8IteratorCurrent(UCharIterator *iter)

{
  void *pvVar1;
  UChar32 UVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar6;
  
  if (iter->reservedField != 0) {
    return iter->reservedField & 0x3ffU | 0xdc00;
  }
  lVar7 = (long)iter->start;
  uVar3 = iter->limit;
  UVar2 = -1;
  if (iter->start < (int)uVar3) {
    pvVar1 = iter->context;
    bVar9 = *(byte *)((long)pvVar1 + lVar7);
    uVar4 = (uint)bVar9;
    if (-1 < (char)bVar9) {
      return uVar4;
    }
    uVar6 = lVar7 + 1;
    UVar2 = 0xfffd;
    if ((uint)uVar6 != uVar3) {
      if (bVar9 < 0xe0) {
        if (bVar9 < 0xc2) {
          return 0xfffd;
        }
        uVar4 = uVar4 & 0x1f;
      }
      else {
        if (bVar9 < 0xf0) {
          uVar4 = uVar4 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar4] >> (*(byte *)((long)pvVar1 + uVar6) >> 5) & 1) ==
              0) {
            return 0xfffd;
          }
          bVar9 = *(byte *)((long)pvVar1 + uVar6) & 0x3f;
        }
        else {
          if (0xf4 < bVar9) {
            return 0xfffd;
          }
          if (((uint)(int)""[*(byte *)((long)pvVar1 + uVar6) >> 4] >> (uVar4 - 0xf0 & 0x1f) & 1) ==
              0) {
            return 0xfffd;
          }
          uVar8 = lVar7 + 2;
          if ((uint)uVar8 == uVar3) {
            return 0xfffd;
          }
          bVar9 = *(char *)((long)pvVar1 + uVar8) + 0x80;
          if (0x3f < bVar9) {
            return 0xfffd;
          }
          uVar4 = *(byte *)((long)pvVar1 + uVar6) & 0x3f | (uVar4 - 0xf0) * 0x40;
          uVar6 = uVar8 & 0xffffffff;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        if (uVar5 == uVar3) {
          return 0xfffd;
        }
        uVar4 = (uint)bVar9 | uVar4 << 6;
      }
      uVar3 = *(byte *)((long)pvVar1 + (long)(int)uVar6) ^ 0x80;
      if ((byte)uVar3 < 0x40) {
        uVar5 = (uVar4 >> 4) + 0xd7c0 & 0xffff;
        if (uVar4 < 0x400) {
          uVar5 = uVar4 << 6 | uVar3;
        }
        return uVar5;
      }
    }
  }
  return UVar2;
}

Assistant:

static UChar32 U_CALLCONV
utf8IteratorCurrent(UCharIterator *iter) {
    if(iter->reservedField!=0) {
        return U16_TRAIL(iter->reservedField);
    } else if(iter->start<iter->limit) {
        const uint8_t *s=(const uint8_t *)iter->context;
        UChar32 c;
        int32_t i=iter->start;

        U8_NEXT_OR_FFFD(s, i, iter->limit, c);
        if(c<=0xffff) {
            return c;
        } else {
            return U16_LEAD(c);
        }
    } else {
        return U_SENTINEL;
    }
}